

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O2

TestLog * glu::operator<<(TestLog *log,ShaderProgram *shaderProgram)

{
  pointer ppSVar1;
  ShaderInfo **shaderInfos;
  int shaderNdx;
  long lVar2;
  int shaderType;
  long lVar3;
  vector<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> shaderPtrs;
  ShaderInfo *local_50;
  _Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (ShaderInfo **)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    for (lVar2 = 0;
        ppSVar1 = shaderProgram->m_shaders[lVar3].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start,
        lVar2 < (int)((ulong)((long)shaderProgram->m_shaders[lVar3].
                                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3
                     ); lVar2 = lVar2 + 1) {
      local_50 = &ppSVar1[lVar2]->m_info;
      std::vector<glu::ShaderInfo_const*,std::allocator<glu::ShaderInfo_const*>>::
      emplace_back<glu::ShaderInfo_const*>
                ((vector<glu::ShaderInfo_const*,std::allocator<glu::ShaderInfo_const*>> *)&local_48,
                 &local_50);
    }
  }
  shaderInfos = (ShaderInfo **)0x0;
  if ((long)local_48._M_impl.super__Vector_impl_data._M_finish -
      (long)local_48._M_impl.super__Vector_impl_data._M_start != 0) {
    shaderInfos = local_48._M_impl.super__Vector_impl_data._M_start;
  }
  logShaderProgram(log,&(shaderProgram->m_program).m_info,
                   (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3,shaderInfos);
  std::_Vector_base<const_glu::ShaderInfo_*,_std::allocator<const_glu::ShaderInfo_*>_>::
  ~_Vector_base(&local_48);
  return log;
}

Assistant:

tcu::TestLog& operator<< (tcu::TestLog& log, const ShaderProgram& shaderProgram)
{
	std::vector<const ShaderInfo*>	shaderPtrs;

	for (int shaderType = 0; shaderType < SHADERTYPE_LAST; shaderType++)
	{
		for (int shaderNdx = 0; shaderNdx < shaderProgram.getNumShaders((ShaderType)shaderType); shaderNdx++)
			shaderPtrs.push_back(&shaderProgram.getShaderInfo((ShaderType)shaderType, shaderNdx));
	}

	logShaderProgram(log, shaderProgram.getProgramInfo(), shaderPtrs.size(), shaderPtrs.empty() ? DE_NULL : &shaderPtrs[0]);

	return log;
}